

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall
GrcManager::ConvertBetweenXYAndGpoint(GrcManager *this,GrcFont *pfont,gid16 wGlyphID)

{
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  int iVar5;
  size_type_conflict sVar6;
  int *piVar7;
  ulong uVar8;
  reference ppGVar9;
  Symbol pGVar10;
  void *pvVar11;
  short in_DX;
  int *in_RSI;
  long in_RDI;
  bool fDeleteGpoint;
  Symbol psymBasePt;
  GdlExpression *pexpY_1;
  GdlExpression *pexpX_1;
  int nIDY;
  int nIDX;
  Symbol psymY;
  Symbol psymX;
  int mY;
  int mX;
  int nGPoint;
  GrpLineAndFile lnf_1;
  bool fShadow;
  bool fOverride_1;
  int munitPR;
  int nPR;
  GdlExpression *pexpGpoint_1;
  int iAttrIDgpoint;
  Symbol psymAttrGpoint;
  GdlExpression *pexpGpoint;
  int nGPointValue;
  Symbol psymGPoint;
  int nY;
  int munitPRy;
  int nPRy;
  GdlExpression *pexpY;
  int nX;
  GrpLineAndFile lnf;
  bool fShadowY;
  bool fShadowX;
  bool fOverride;
  int munitPRx;
  int nPRx;
  GdlExpression *pexpX;
  int iAttrIDy;
  int iAttrIDx;
  Symbol psymAttrY;
  Symbol psymAttrX;
  Symbol psymAttr;
  int n;
  uint iAttrID;
  utf16 wActual;
  int cStdStyles;
  string *in_stack_fffffffffffffae8;
  undefined4 uVar12;
  undefined4 uVar13;
  GrcSymbolTableEntry *in_stack_fffffffffffffaf0;
  value_type *__x;
  GdlObject *__x_00;
  int in_stack_fffffffffffffb00;
  undefined2 in_stack_fffffffffffffb04;
  utf16 in_stack_fffffffffffffb06;
  undefined6 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0e;
  undefined1 in_stack_fffffffffffffb0f;
  int *in_stack_fffffffffffffb10;
  undefined2 in_stack_fffffffffffffb18;
  short in_stack_fffffffffffffb1a;
  undefined4 in_stack_fffffffffffffb1c;
  GrcSymbolTableEntry *in_stack_fffffffffffffb20;
  GrcGlyphAttrMatrix *in_stack_fffffffffffffb28;
  allocator *paVar14;
  GrcSymbolTableEntry *in_stack_fffffffffffffb38;
  bool *in_stack_fffffffffffffb40;
  GrcErrorList *in_stack_fffffffffffffb48;
  GrcSymbolTableEntry *in_stack_fffffffffffffb50;
  bool *local_4a8;
  undefined6 in_stack_fffffffffffffb68;
  GdlObject *in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbf0;
  gid16 in_stack_fffffffffffffbf6;
  GrcFont *in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  long *in_stack_fffffffffffffc50;
  long *in_stack_fffffffffffffc58;
  int *in_stack_fffffffffffffc60;
  undefined6 in_stack_fffffffffffffc68;
  short in_stack_fffffffffffffc6e;
  int in_stack_fffffffffffffcc8;
  uint in_stack_fffffffffffffccc;
  GrcFont *pGVar15;
  GrcFont *this_00;
  allocator local_309;
  string local_308 [32];
  string local_2e8 [39];
  undefined1 local_2c1 [33];
  string local_2a0 [39];
  undefined1 local_279 [33];
  Symbol local_258;
  void *local_250;
  void *local_248;
  int local_23c;
  int local_238;
  allocator local_231;
  string local_230 [32];
  GrcSymbolTableEntry *local_210;
  allocator local_201;
  string local_200 [32];
  Symbol local_1e0;
  undefined4 local_1cc;
  GdlObject local_1c8;
  undefined1 local_19a;
  string local_199 [9];
  GrcSymbolTableEntry *local_190;
  uint local_184;
  GrcFont *local_180;
  allocator local_171;
  string local_170 [32];
  void *local_150;
  int local_148;
  allocator local_141;
  string local_140 [32];
  Symbol local_120;
  undefined1 local_114 [8];
  int local_10c;
  long *local_108;
  undefined1 local_100 [4];
  undefined4 local_fc;
  value_type local_f8 [5];
  undefined1 local_cb;
  undefined1 local_ca [6];
  int local_c4;
  long *local_c0;
  int local_b4;
  uint local_b0;
  allocator local_a9;
  string local_a8 [32];
  Symbol local_88;
  GrcFont *local_80;
  undefined1 local_61 [33];
  GrcFont *local_40;
  int local_34;
  uint local_30;
  short local_2a;
  int local_28;
  int local_24;
  int local_20;
  short local_1a;
  int *local_18;
  
  local_1a = in_DX;
  local_18 = in_RSI;
  sVar6 = std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::size
                    ((vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_> *)
                     (in_RDI + 0xb0));
  local_24 = (int)sVar6;
  local_28 = 1;
  piVar7 = std::max<int>(&local_24,&local_28);
  local_20 = *piVar7;
  iVar5 = ActualForPseudo((GrcManager *)
                          CONCAT17(in_stack_fffffffffffffb0f,
                                   CONCAT16(in_stack_fffffffffffffb0e,in_stack_fffffffffffffb08)),
                          in_stack_fffffffffffffb06);
  local_2a = (short)iVar5;
  if (local_2a == 0) {
    local_2a = local_1a;
  }
  local_4a8 = in_stack_fffffffffffffb40;
  for (local_30 = 0; uVar8 = (ulong)local_30,
      sVar6 = std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::size
                        ((vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_> *)
                         (in_RDI + 0x1f0)), uVar8 < sVar6; local_30 = local_30 + 1) {
    for (local_34 = local_20; local_34 != 0; local_34 = local_34 + -1) {
      ppGVar9 = std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::
                operator[]((vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_> *)
                           (in_RDI + 0x1f0),(ulong)local_30);
      pGVar15 = (GrcFont *)*ppGVar9;
      this_00 = (GrcFont *)local_61;
      local_40 = pGVar15;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_61 + 1),"x",(allocator *)this_00);
      bVar1 = GrcSymbolTableEntry::LastFieldIs(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      in_stack_fffffffffffffccc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffccc);
      std::__cxx11::string::~string((string *)(local_61 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_61);
      if ((in_stack_fffffffffffffccc & 0x1000000) == 0) {
        in_stack_fffffffffffffbf8 = local_40;
        std::allocator<char>::allocator();
        uVar3 = (undefined1)in_stack_fffffffffffffbf6;
        std::__cxx11::string::string(local_170,"gpoint",&local_171);
        bVar1 = GrcSymbolTableEntry::LastFieldIs
                          (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
        in_stack_fffffffffffffbf6 = CONCAT11(bVar1,uVar3);
        std::__cxx11::string::~string(local_170);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
        if ((in_stack_fffffffffffffbf6 & 0x100) != 0) {
          local_180 = local_40;
          local_184 = local_30;
          __x_00 = &local_1c8;
          GrpLineAndFile::GrpLineAndFile((GrpLineAndFile *)0x145d17);
          in_stack_fffffffffffffaf0 = (GrcSymbolTableEntry *)&local_19a;
          in_stack_fffffffffffffae8 = local_199;
          in_stack_fffffffffffffbe8 = __x_00;
          GrcGlyphAttrMatrix::Get
                    (in_stack_fffffffffffffb28,(gid16)((ulong)in_stack_fffffffffffffb20 >> 0x30),
                     (int)in_stack_fffffffffffffb20,
                     (GdlExpression **)
                     CONCAT44(in_stack_fffffffffffffb1c,
                              CONCAT22(in_stack_fffffffffffffb1a,in_stack_fffffffffffffb18)),
                     in_stack_fffffffffffffb10,
                     (int *)CONCAT17(in_stack_fffffffffffffb0f,
                                     CONCAT16(in_stack_fffffffffffffb0e,in_stack_fffffffffffffb08)),
                     local_4a8,&in_stack_fffffffffffffb48->m_fFatalError,
                     (GrpLineAndFile *)in_stack_fffffffffffffb50);
          if (local_190 == (GrcSymbolTableEntry *)0x0) {
            local_fc = 7;
          }
          else {
            bVar2 = (**(code **)(*(long *)local_190 + 0x38))(local_190,&local_1cc,0);
            if ((bVar2 & 1) == 0) {
              local_fc = 7;
            }
            else {
              iVar5 = GrcFont::GetXYAtPoint
                                ((GrcFont *)
                                 CONCAT26(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68),
                                 (gid16)((ulong)in_stack_fffffffffffffc60 >> 0x30),
                                 (int)in_stack_fffffffffffffc60,(int *)in_stack_fffffffffffffc58,
                                 (int *)in_stack_fffffffffffffc50,
                                 (GdlObject *)
                                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
              if (iVar5 != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_200,"x",&local_201);
                pGVar10 = GrcSymbolTableEntry::PointSisterField
                                    (in_stack_fffffffffffffb50,(string *)in_stack_fffffffffffffb48);
                std::__cxx11::string::~string(local_200);
                std::allocator<char>::~allocator((allocator<char> *)&local_201);
                local_1e0 = pGVar10;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_230,"y",&local_231);
                pGVar10 = GrcSymbolTableEntry::PointSisterField
                                    (in_stack_fffffffffffffb50,(string *)in_stack_fffffffffffffb48);
                std::__cxx11::string::~string(local_230);
                std::allocator<char>::~allocator((allocator<char> *)&local_231);
                local_210 = pGVar10;
                local_238 = GrcSymbolTableEntry::InternalID(local_1e0);
                local_23c = GrcSymbolTableEntry::InternalID(local_210);
                pvVar11 = operator_new(0x40);
                GdlNumericExpression::GdlNumericExpression
                          ((GdlNumericExpression *)
                           CONCAT26(in_stack_fffffffffffffb06,
                                    CONCAT24(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00)),
                           (int)((ulong)__x_00 >> 0x20),(int)__x_00);
                local_248 = pvVar11;
                GdlObject::CopyLineAndFile
                          ((GdlObject *)in_stack_fffffffffffffaf0,
                           (GdlObject *)in_stack_fffffffffffffae8);
                pvVar11 = operator_new(0x40);
                GdlNumericExpression::GdlNumericExpression
                          ((GdlNumericExpression *)
                           CONCAT26(in_stack_fffffffffffffb06,
                                    CONCAT24(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00)),
                           (int)((ulong)__x_00 >> 0x20),(int)__x_00);
                local_250 = pvVar11;
                GdlObject::CopyLineAndFile
                          ((GdlObject *)in_stack_fffffffffffffaf0,
                           (GdlObject *)in_stack_fffffffffffffae8);
                uVar13 = (undefined4)((ulong)in_stack_fffffffffffffae8 >> 0x20);
                uVar12 = (undefined4)((ulong)in_stack_fffffffffffffaf0 >> 0x20);
                std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::push_back
                          ((vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *)
                           CONCAT26(in_stack_fffffffffffffb06,
                                    CONCAT24(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00)),
                           (value_type *)__x_00);
                std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::push_back
                          ((vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *)
                           CONCAT26(in_stack_fffffffffffffb06,
                                    CONCAT24(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00)),
                           (value_type *)__x_00);
                iVar5 = (int)((ulong)__x_00 >> 0x20);
                uVar3 = GrcGlyphAttrMatrix::Defined
                                  ((GrcGlyphAttrMatrix *)
                                   CONCAT17(in_stack_fffffffffffffb0f,
                                            CONCAT16(in_stack_fffffffffffffb0e,
                                                     in_stack_fffffffffffffb08)),
                                   in_stack_fffffffffffffb06,in_stack_fffffffffffffb00,iVar5);
                if (((bool)uVar3) &&
                   (uVar4 = GrcGlyphAttrMatrix::Defined
                                      ((GrcGlyphAttrMatrix *)
                                       CONCAT17(in_stack_fffffffffffffb0f,
                                                CONCAT16(in_stack_fffffffffffffb0e,
                                                         in_stack_fffffffffffffb08)),
                                       in_stack_fffffffffffffb06,in_stack_fffffffffffffb00,iVar5),
                   (bool)uVar4)) {
                  pGVar10 = GrcSymbolTableEntry::BasePoint((GrcSymbolTableEntry *)0x1461cb);
                  local_4a8 = (bool *)0x0;
                  if (local_190 != (GrcSymbolTableEntry *)0x0) {
                    local_4a8 = (bool *)&local_190->field_0x8;
                  }
                  in_stack_fffffffffffffb48 = (GrcErrorList *)local_279;
                  in_stack_fffffffffffffb50 = local_190;
                  local_258 = pGVar10;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)(local_279 + 1),
                             "Both x/y coordinates and gpoint are defined for ",
                             (allocator *)in_stack_fffffffffffffb48);
                  GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffffb38);
                  in_stack_fffffffffffffb38 = (GrcSymbolTableEntry *)local_2c1;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)(local_2c1 + 1)," for glyph ",
                             (allocator *)in_stack_fffffffffffffb38);
                  GdlGlyphDefn::GlyphIDString_abi_cxx11_((gid16)(in_stack_fffffffffffffccc >> 0x10))
                  ;
                  paVar14 = &local_309;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_308,"; only gpoint will be used",paVar14);
                  uVar12 = (undefined4)((ulong)local_308 >> 0x20);
                  uVar13 = (undefined4)((ulong)local_2e8 >> 0x20);
                  GrcErrorList::AddWarning
                            (in_stack_fffffffffffffb48,(int)((ulong)local_4a8 >> 0x20),
                             (GdlObject *)in_stack_fffffffffffffb38,(string *)paVar14,
                             (string *)in_stack_fffffffffffffb28,
                             &in_stack_fffffffffffffb20->m_staFieldName,&pGVar10->m_staFieldName,
                             (string *)CONCAT17(uVar3,CONCAT16(uVar4,in_stack_fffffffffffffb68)));
                  std::__cxx11::string::~string(local_308);
                  std::allocator<char>::~allocator((allocator<char> *)&local_309);
                  std::__cxx11::string::~string(local_2e8);
                  std::__cxx11::string::~string((string *)(local_2c1 + 1));
                  std::allocator<char>::~allocator((allocator<char> *)local_2c1);
                  std::__cxx11::string::~string(local_2a0);
                  std::__cxx11::string::~string((string *)(local_279 + 1));
                  std::allocator<char>::~allocator((allocator<char> *)local_279);
                }
                in_stack_fffffffffffffb28 = (GrcGlyphAttrMatrix *)0x0;
                if (local_190 != (GrcSymbolTableEntry *)0x0) {
                  in_stack_fffffffffffffb28 = (GrcGlyphAttrMatrix *)&local_190->field_0x8;
                }
                in_stack_fffffffffffffb10 = local_18;
                in_stack_fffffffffffffb1a = local_2a;
                in_stack_fffffffffffffb1c = local_1cc;
                in_stack_fffffffffffffb20 = local_190;
                bVar1 = GrcFont::IsPointAlone
                                  (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf6,
                                   in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
                in_stack_fffffffffffffb0f = bVar1;
                GrcGlyphAttrMatrix::Set
                          (in_stack_fffffffffffffb28,
                           (gid16)((ulong)in_stack_fffffffffffffb20 >> 0x30),
                           (int)in_stack_fffffffffffffb20,
                           (GdlExpression *)
                           CONCAT44(in_stack_fffffffffffffb1c,
                                    CONCAT22(in_stack_fffffffffffffb1a,in_stack_fffffffffffffb18)),
                           (int)((ulong)in_stack_fffffffffffffb10 >> 0x20),
                           (int)in_stack_fffffffffffffb10,bVar1,(bool)in_stack_fffffffffffffb0e,
                           (GrpLineAndFile *)in_stack_fffffffffffffb50);
                in_stack_fffffffffffffaf0 =
                     (GrcSymbolTableEntry *)
                     (CONCAT44(uVar12,(uint)(byte)~bVar1) & 0xffffffff00000001);
                in_stack_fffffffffffffae8 =
                     (string *)(CONCAT44(uVar13,(uint)(byte)local_199[0]) & 0xffffffff00000001);
                GrcGlyphAttrMatrix::Set
                          (in_stack_fffffffffffffb28,
                           (gid16)((ulong)in_stack_fffffffffffffb20 >> 0x30),
                           (int)in_stack_fffffffffffffb20,
                           (GdlExpression *)
                           CONCAT44(in_stack_fffffffffffffb1c,
                                    CONCAT22(in_stack_fffffffffffffb1a,in_stack_fffffffffffffb18)),
                           (int)((ulong)in_stack_fffffffffffffb10 >> 0x20),
                           (int)in_stack_fffffffffffffb10,(bool)in_stack_fffffffffffffb0f,
                           (bool)in_stack_fffffffffffffb0e,
                           (GrpLineAndFile *)in_stack_fffffffffffffb50);
                if (bVar1) {
                  in_stack_fffffffffffffaf0 =
                       (GrcSymbolTableEntry *)
                       ((ulong)in_stack_fffffffffffffaf0 & 0xffffffff00000000);
                  in_stack_fffffffffffffae8 =
                       (string *)CONCAT44((int)((ulong)in_stack_fffffffffffffae8 >> 0x20),1);
                  GrcGlyphAttrMatrix::Set
                            (in_stack_fffffffffffffb28,
                             (gid16)((ulong)in_stack_fffffffffffffb20 >> 0x30),
                             (int)in_stack_fffffffffffffb20,
                             (GdlExpression *)
                             CONCAT44(in_stack_fffffffffffffb1c,
                                      CONCAT22(in_stack_fffffffffffffb1a,in_stack_fffffffffffffb18))
                             ,(int)((ulong)in_stack_fffffffffffffb10 >> 0x20),
                             (int)in_stack_fffffffffffffb10,(bool)in_stack_fffffffffffffb0f,
                             (bool)in_stack_fffffffffffffb0e,
                             (GrpLineAndFile *)in_stack_fffffffffffffb50);
                }
              }
              local_fc = 0;
            }
          }
          GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x146731);
        }
      }
      else {
        local_80 = local_40;
        paVar14 = &local_a9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,"y",paVar14);
        pGVar10 = GrcSymbolTableEntry::PointSisterField
                            (in_stack_fffffffffffffb50,(string *)in_stack_fffffffffffffb48);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        local_88 = pGVar10;
        if (pGVar10 != (Symbol)0x0) {
          local_b0 = local_30;
          local_b4 = GrcSymbolTableEntry::InternalID(pGVar10);
          GrpLineAndFile::GrpLineAndFile((GrpLineAndFile *)0x1455b3);
          in_stack_fffffffffffffaf0 = (GrcSymbolTableEntry *)local_ca;
          in_stack_fffffffffffffae8 = (string *)(local_ca + 1);
          GrcGlyphAttrMatrix::Get
                    (in_stack_fffffffffffffb28,(gid16)((ulong)in_stack_fffffffffffffb20 >> 0x30),
                     (int)in_stack_fffffffffffffb20,
                     (GdlExpression **)
                     CONCAT44(in_stack_fffffffffffffb1c,
                              CONCAT22(in_stack_fffffffffffffb1a,in_stack_fffffffffffffb18)),
                     in_stack_fffffffffffffb10,
                     (int *)CONCAT17(in_stack_fffffffffffffb0f,
                                     CONCAT16(in_stack_fffffffffffffb0e,in_stack_fffffffffffffb08)),
                     local_4a8,&in_stack_fffffffffffffb48->m_fFatalError,
                     (GrpLineAndFile *)in_stack_fffffffffffffb50);
          if (local_c0 == (long *)0x0) {
            local_fc = 7;
          }
          else {
            bVar2 = (**(code **)(*local_c0 + 0x38))(local_c0,local_100,0);
            if ((bVar2 & 1) == 0) {
              local_fc = 7;
            }
            else {
              __x = local_f8;
              in_stack_fffffffffffffaf0 = (GrcSymbolTableEntry *)&local_cb;
              in_stack_fffffffffffffae8 = (string *)(local_ca + 1);
              GrcGlyphAttrMatrix::Get
                        (in_stack_fffffffffffffb28,(gid16)((ulong)in_stack_fffffffffffffb20 >> 0x30)
                         ,(int)in_stack_fffffffffffffb20,
                         (GdlExpression **)
                         CONCAT44(in_stack_fffffffffffffb1c,
                                  CONCAT22(in_stack_fffffffffffffb1a,in_stack_fffffffffffffb18)),
                         in_stack_fffffffffffffb10,
                         (int *)CONCAT17(in_stack_fffffffffffffb0f,
                                         CONCAT16(in_stack_fffffffffffffb0e,
                                                  in_stack_fffffffffffffb08)),local_4a8,
                         &in_stack_fffffffffffffb48->m_fFatalError,
                         (GrpLineAndFile *)in_stack_fffffffffffffb50);
              if (local_108 == (long *)0x0) {
                local_fc = 7;
              }
              else {
                bVar2 = (**(code **)(*local_108 + 0x38))(local_108,local_114,0);
                if ((bVar2 & 1) == 0) {
                  local_fc = 7;
                }
                else if ((((byte)local_ca[0] & 1) == 0) && (((byte)local_cb & 1) == 0)) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_140,"gpoint",&local_141);
                  pGVar10 = GrcSymbolTableEntry::PointSisterField
                                      (in_stack_fffffffffffffb50,(string *)in_stack_fffffffffffffb48
                                      );
                  std::__cxx11::string::~string(local_140);
                  std::allocator<char>::~allocator((allocator<char> *)&local_141);
                  local_120 = pGVar10;
                  local_c4 = GrcFont::ScaledToAbsolute
                                       ((GrcFont *)
                                        CONCAT17(in_stack_fffffffffffffb0f,
                                                 CONCAT16(in_stack_fffffffffffffb0e,
                                                          in_stack_fffffffffffffb08)),
                                        CONCAT22(in_stack_fffffffffffffb06,in_stack_fffffffffffffb04
                                                ),in_stack_fffffffffffffb00);
                  local_10c = GrcFont::ScaledToAbsolute
                                        ((GrcFont *)
                                         CONCAT17(in_stack_fffffffffffffb0f,
                                                  CONCAT16(in_stack_fffffffffffffb0e,
                                                           in_stack_fffffffffffffb08)),
                                         CONCAT22(in_stack_fffffffffffffb06,
                                                  in_stack_fffffffffffffb04),
                                         in_stack_fffffffffffffb00);
                  in_stack_fffffffffffffc60 = local_18;
                  in_stack_fffffffffffffc6e = local_2a;
                  piVar7 = std::max<int>(&local_c4,&local_10c);
                  in_stack_fffffffffffffc4c = *piVar7;
                  in_stack_fffffffffffffc58 = (long *)0x0;
                  if (local_c0 != (long *)0x0) {
                    in_stack_fffffffffffffc58 = local_c0 + 1;
                  }
                  in_stack_fffffffffffffc50 = local_c0;
                  in_stack_fffffffffffffc48 =
                       GrcFont::GetPointAtXY
                                 (this_00,(gid16)((ulong)pGVar15 >> 0x30),(int)pGVar15,
                                  in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8,
                                  (GdlObject *)paVar14);
                  local_148 = in_stack_fffffffffffffc48;
                  if ((-1 < in_stack_fffffffffffffc48) &&
                     (bVar1 = GrcFont::IsPointAlone
                                        (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf6,
                                         in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8),
                     !bVar1)) {
                    pvVar11 = operator_new(0x40);
                    GdlNumericExpression::GdlNumericExpression
                              ((GdlNumericExpression *)
                               CONCAT26(in_stack_fffffffffffffb06,
                                        CONCAT24(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00
                                                )),(int)((ulong)__x >> 0x20));
                    local_150 = pvVar11;
                    GdlObject::CopyLineAndFile
                              ((GdlObject *)in_stack_fffffffffffffaf0,
                               (GdlObject *)in_stack_fffffffffffffae8);
                    uVar12 = (undefined4)((ulong)in_stack_fffffffffffffae8 >> 0x20);
                    std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::push_back
                              ((vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *)
                               CONCAT26(in_stack_fffffffffffffb06,
                                        CONCAT24(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00
                                                )),__x);
                    GrcSymbolTableEntry::InternalID(local_120);
                    uVar8 = (ulong)in_stack_fffffffffffffaf0 & 0xffffffff00000000;
                    GrcGlyphAttrMatrix::Set
                              (in_stack_fffffffffffffb28,
                               (gid16)((ulong)in_stack_fffffffffffffb20 >> 0x30),
                               (int)in_stack_fffffffffffffb20,
                               (GdlExpression *)
                               CONCAT44(in_stack_fffffffffffffb1c,
                                        CONCAT22(in_stack_fffffffffffffb1a,in_stack_fffffffffffffb18
                                                )),(int)((ulong)in_stack_fffffffffffffb10 >> 0x20),
                               (int)in_stack_fffffffffffffb10,(bool)in_stack_fffffffffffffb0f,
                               (bool)in_stack_fffffffffffffb0e,
                               (GrpLineAndFile *)in_stack_fffffffffffffb50);
                    uVar8 = uVar8 & 0xffffffff00000000;
                    GrcGlyphAttrMatrix::Set
                              (in_stack_fffffffffffffb28,
                               (gid16)((ulong)in_stack_fffffffffffffb20 >> 0x30),
                               (int)in_stack_fffffffffffffb20,
                               (GdlExpression *)
                               CONCAT44(in_stack_fffffffffffffb1c,
                                        CONCAT22(in_stack_fffffffffffffb1a,in_stack_fffffffffffffb18
                                                )),(int)((ulong)in_stack_fffffffffffffb10 >> 0x20),
                               (int)in_stack_fffffffffffffb10,(bool)in_stack_fffffffffffffb0f,
                               (bool)in_stack_fffffffffffffb0e,
                               (GrpLineAndFile *)in_stack_fffffffffffffb50);
                    in_stack_fffffffffffffaf0 = (GrcSymbolTableEntry *)(uVar8 & 0xffffffff00000000);
                    in_stack_fffffffffffffae8 = (string *)CONCAT44(uVar12,1);
                    GrcGlyphAttrMatrix::Set
                              (in_stack_fffffffffffffb28,
                               (gid16)((ulong)in_stack_fffffffffffffb20 >> 0x30),
                               (int)in_stack_fffffffffffffb20,
                               (GdlExpression *)
                               CONCAT44(in_stack_fffffffffffffb1c,
                                        CONCAT22(in_stack_fffffffffffffb1a,in_stack_fffffffffffffb18
                                                )),(int)((ulong)in_stack_fffffffffffffb10 >> 0x20),
                               (int)in_stack_fffffffffffffb10,(bool)in_stack_fffffffffffffb0f,
                               (bool)in_stack_fffffffffffffb0e,
                               (GrpLineAndFile *)in_stack_fffffffffffffb50);
                  }
                  local_fc = 0;
                }
                else {
                  local_fc = 7;
                }
              }
            }
          }
          GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x145c30);
        }
      }
    }
  }
  return;
}

Assistant:

void GrcManager::ConvertBetweenXYAndGpoint(GrcFont * pfont, gid16 wGlyphID)
{
	int cStdStyles = max(signed(m_vpsymStyles.size()), 1);
	utf16 wActual = ActualForPseudo(wGlyphID);
	if (wActual == 0)
		wActual = wGlyphID;

	for (auto iAttrID = 0U; iAttrID < m_vpsymGlyphAttrs.size(); ++iAttrID)
	{
		for (auto n = cStdStyles; n; --n)
		{
			Symbol psymAttr = m_vpsymGlyphAttrs[iAttrID];

			if (psymAttr->LastFieldIs("x"))
			{
				Symbol psymAttrX = psymAttr;
				Symbol psymAttrY = psymAttrX->PointSisterField("y");
				if (!psymAttrY)
					continue; // need both x and y to convert
				int iAttrIDx = iAttrID;
				int iAttrIDy = psymAttrY->InternalID();

				GdlExpression * pexpX;
				int nPRx;
				int munitPRx;
				bool fOverride, fShadowX, fShadowY;
				GrpLineAndFile lnf;
				m_pgax->Get(wGlyphID, iAttrIDx,
					&pexpX, &nPRx, &munitPRx, &fOverride, &fShadowX, &lnf);

				if (!pexpX)
					continue;
				int nX;
				if (!pexpX->ResolveToInteger(&nX, false))
					continue;

				GdlExpression * pexpY;
				int nPRy;
				int munitPRy;
				m_pgax->Get(wGlyphID, iAttrIDy,
					&pexpY, &nPRy, &munitPRy, &fOverride, &fShadowY, &lnf);

				if (!pexpY)
					continue;
				int nY;
				if (!pexpY->ResolveToInteger(&nY, false))
					continue;

				Assert(fShadowX == fShadowY);
				if (fShadowX || fShadowY)
					continue;

				//	Find the corresponding gpoint attribute.
				Symbol psymGPoint = psymAttrX->PointSisterField("gpoint");
				Assert(psymGPoint);

				nPRx = pfont->ScaledToAbsolute(nPRx, munitPRx);
				nPRy = pfont->ScaledToAbsolute(nPRy, munitPRy);

				//	See if we can find a corresponding on-curve point.
				int nGPointValue = pfont->GetPointAtXY(wActual, nX, nY, max(nPRx, nPRy), pexpX);
				if (nGPointValue > -1 && !pfont->IsPointAlone(wActual, nGPointValue, pexpX))
				{
					//	We found one. Set the value of the gpoint field.
					GdlExpression * pexpGpoint = new GdlNumericExpression(nGPointValue);
					pexpGpoint->CopyLineAndFile(*pexpX);

					m_vpexpModified.push_back(pexpGpoint);	// so we can delete it later
					m_pgax->Set(wGlyphID, psymGPoint->InternalID(),
						pexpGpoint, 0, munitPRx, fOverride, false, lnf);

					//	Clear the x and y fields.
					m_pgax->Set(wGlyphID, iAttrIDx, NULL, 0, munitPRx, true, false, lnf);
					m_pgax->Set(wGlyphID, iAttrIDy, NULL, 0, munitPRy, true, false, lnf);

					//	Don't delete the actual expressions, because they are owned by the
					//	original assignment statements, which will delete them.
				}
			}
			else if (psymAttr->LastFieldIs("gpoint"))
			{
				Symbol psymAttrGpoint = psymAttr;

				int iAttrIDgpoint = iAttrID;
				GdlExpression * pexpGpoint;
				int nPR;
				int munitPR;
				bool fOverride, fShadow;
				GrpLineAndFile lnf;
				m_pgax->Get(wGlyphID, iAttrIDgpoint,
					&pexpGpoint, &nPR, &munitPR, &fOverride, &fShadow, &lnf);
				Assert(!fShadow);

				if (!pexpGpoint)
					continue;
				int nGPoint;
				if (!pexpGpoint->ResolveToInteger(&nGPoint, false))
					continue;

				//	Convert gpoint to x/y. On Linux gpoint will never work.
				//	It won't work on Windows either if the point comprises a single-point path,
				//	so in that case, delete the gpoint setting altogether. In other cases,
				//	leave both around, so if gpoint doesn't work, the engine can fall back
				//	to x/y.
				int mX, mY;
				if (pfont->GetXYAtPoint(wActual, nGPoint, &mX, &mY, pexpGpoint))
				{
					//	Create equivalent x/y statements.

					Symbol psymX = psymAttrGpoint->PointSisterField("x");
					Symbol psymY = psymAttrGpoint->PointSisterField("y");
					Assert(psymX);
					Assert(psymY);
					int nIDX = psymX->InternalID();
					int nIDY = psymY->InternalID();

					GdlExpression * pexpX = new GdlNumericExpression(mX, kmunitUnscaled);
					pexpX->CopyLineAndFile(*pexpGpoint);

					GdlExpression * pexpY = new GdlNumericExpression(mY, kmunitUnscaled);
					pexpY->CopyLineAndFile(*pexpGpoint);

					m_vpexpModified.push_back(pexpX);	// so we can delete them later
					m_vpexpModified.push_back(pexpY);

					if (m_pgax->Defined(wGlyphID, nIDX) && m_pgax->Defined(wGlyphID, nIDY))
					{
						Symbol psymBasePt = psymAttr->BasePoint();
						g_errorList.AddWarning(4513, pexpGpoint,
							"Both x/y coordinates and gpoint are defined for ",
							psymBasePt->FullName(),
							" for glyph ",
							GdlGlyphDefn::GlyphIDString(wGlyphID),
							"; only gpoint will be used");
					}

					bool fDeleteGpoint = pfont->IsPointAlone(wActual, nGPoint, pexpGpoint);

					// Store the new expressions as glyph attribute assignments.
					m_pgax->Set(wGlyphID, nIDX, pexpX, nPR, munitPR,
						fOverride, !fDeleteGpoint, lnf);
					m_pgax->Set(wGlyphID, nIDY, pexpY, nPR, munitPR,
						fOverride, !fDeleteGpoint, lnf);

					if (fDeleteGpoint)
					{
						//	Since this is a single-point path, it won't show up in the
						//	hinted glyph from the graphics object, so we really have to
						//	use the x/y coordinates. So clear the gpoint field.
						m_pgax->Set(wGlyphID, iAttrIDgpoint, NULL, 0, munitPR, true, false, lnf);
					}

					//	Don't delete the actual expression, because it is owned by the
					//	original assignment statements, which will delete it.
				}
			}
		}
	}
}